

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::Desugarer::makeArrayComprehension(Desugarer *this,ArrayComprehension *ast)

{
  pointer pcVar1;
  int iVar2;
  pointer pCVar3;
  AST *pAVar4;
  Kind *pKVar5;
  LocationRange *args;
  Identifier *pIVar6;
  pointer pCVar7;
  Binary *pBVar8;
  Apply *pAVar9;
  int *piVar10;
  Var *pVVar11;
  Index *body;
  Function *pFVar12;
  LiteralString *b;
  Array *expr;
  long lVar13;
  Fodder *pFVar14;
  uint uVar15;
  long lVar16;
  Desugarer *pDVar17;
  uint uVar18;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *pvVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  initializer_list<jsonnet::internal::ArgParam> __l;
  initializer_list<jsonnet::internal::ArgParam> __l_00;
  initializer_list<jsonnet::internal::ArgParam> __l_01;
  initializer_list<jsonnet::internal::Local::Bind> __l_02;
  initializer_list<jsonnet::internal::ArgParam> __l_03;
  bool local_505;
  bool local_504;
  bool local_503;
  bool local_502;
  bool local_501;
  size_type local_500;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *local_4f8;
  Desugarer *local_4f0;
  LocationRange *local_4e8;
  allocator_type local_4db;
  allocator_type local_4da;
  allocator_type local_4d9;
  ArrayComprehension *local_4d8;
  Array *local_4d0;
  AST *in;
  pointer local_4c0;
  AST *out;
  ArgParam *local_4b0;
  long local_4a8;
  ulong local_4a0;
  BinaryOp local_494;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  _i;
  undefined1 local_478 [32];
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  _aux;
  undefined1 local_440 [32];
  ArgParam *local_420;
  AST *one;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> local_410;
  Binds local_3f8;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_3e0;
  UStringStream ss;
  ArgParam local_370;
  Desugarer local_318 [11];
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  local_268;
  Fodder *local_248;
  Fodder *local_240;
  LiteralNumber *local_238;
  Fodder *local_230;
  sockaddr *local_228;
  long local_220;
  Error *local_218;
  Var *local_210;
  Apply *local_208;
  Apply *local_200;
  Conditional *local_1f8;
  void *local_1f0;
  void *local_1e8;
  Var *local_1e0;
  Var *local_1d8;
  Local *local_1d0;
  Apply *local_1c8;
  Var *local_1c0;
  Binary *local_1b8;
  Conditional *local_1b0;
  undefined1 local_1a8 [88];
  ArgParam local_150;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_f8;
  ArgParam local_e0;
  ArgParam local_88;
  
  pCVar7 = (ast->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar3 = (ast->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_238 = Allocator::
              make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                        (this->alloc,(LocationRange *)E,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,(char (*) [4])"0.0");
  one = &Allocator::
         make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                   (this->alloc,(LocationRange *)E,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF,(char (*) [4])"1.0")->super_AST;
  ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&ss,L"$r",L"");
  local_4f0 = this;
  local_4d0 = (Array *)Allocator::makeIdentifier(this->alloc,&ss.buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)ss.buf._M_dataplus._M_p != &ss.buf.field_2) {
    operator_delete(ss.buf._M_dataplus._M_p,
                    CONCAT44(ss.buf.field_2._M_local_buf[1],ss.buf.field_2._M_local_buf[0]) * 4 + 4)
    ;
  }
  ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&ss,L"$l",L"");
  local_4c0 = (pointer)Allocator::makeIdentifier(local_4f0->alloc,&ss.buf);
  pvVar19 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)(((long)pCVar7 - (long)pCVar3 >> 5) * -0x5555555555555555);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)ss.buf._M_dataplus._M_p != &ss.buf.field_2) {
    operator_delete(ss.buf._M_dataplus._M_p,
                    CONCAT44(ss.buf.field_2._M_local_buf[1],ss.buf.field_2._M_local_buf[0]) * 4 + 4)
    ;
  }
  uVar15 = (uint)pvVar19;
  local_500 = (size_type)(int)uVar15;
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&_i,local_500,(allocator_type *)&ss);
  pcVar1 = (pointer)(local_1a8 + 0x10);
  local_4f8 = pvVar19;
  local_4d8 = ast;
  if (0 < (int)uVar15) {
    uVar23 = 0;
    do {
      ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
      ss.buf._M_string_length = 0;
      ss.buf.field_2._M_local_buf[0] = L'\0';
      ::std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
      ::append(&ss.buf,L"$i_");
      UStringStream::operator<<((UStringStream *)&ss.buf,(int)uVar23);
      local_1a8._0_8_ = pcVar1;
      ::std::__cxx11::u32string::_M_construct<char32_t*>
                ((u32string *)local_1a8,ss.buf._M_dataplus._M_p,
                 ss.buf._M_dataplus._M_p + ss.buf._M_string_length);
      pIVar6 = Allocator::makeIdentifier(local_4f0->alloc,(UString *)local_1a8);
      _i.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar23] = pIVar6;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)ss.buf._M_dataplus._M_p != &ss.buf.field_2) {
        operator_delete(ss.buf._M_dataplus._M_p,
                        CONCAT44(ss.buf.field_2._M_local_buf[1],ss.buf.field_2._M_local_buf[0]) * 4
                        + 4);
      }
      uVar23 = uVar23 + 1;
    } while ((uVar15 & 0x7fffffff) != uVar23);
  }
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&_aux,local_500,(allocator_type *)&ss);
  if (0 < (int)(uint)local_4f8) {
    uVar15 = (uint)local_4f8 & 0x7fffffff;
    uVar23 = 0;
    do {
      ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
      ss.buf._M_string_length = 0;
      ss.buf.field_2._M_local_buf[0] = L'\0';
      ::std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
      ::append(&ss.buf,L"$aux_");
      UStringStream::operator<<((UStringStream *)&ss.buf,(int)uVar23);
      local_1a8._0_8_ = pcVar1;
      ::std::__cxx11::u32string::_M_construct<char32_t*>
                ((u32string *)local_1a8,ss.buf._M_dataplus._M_p,
                 ss.buf._M_dataplus._M_p + ss.buf._M_string_length);
      pIVar6 = Allocator::makeIdentifier(local_4f0->alloc,(UString *)local_1a8);
      _aux.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar23] = pIVar6;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)ss.buf._M_dataplus._M_p != &ss.buf.field_2) {
        operator_delete(ss.buf._M_dataplus._M_p,
                        CONCAT44(ss.buf.field_2._M_local_buf[1],ss.buf.field_2._M_local_buf[0]) * 4
                        + 4);
      }
      uVar23 = uVar23 + 1;
    } while (uVar15 != uVar23);
  }
  pDVar17 = local_4f0;
  pCVar7 = (local_4d8->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar7->kind != FOR) {
    __assert_fail("ast->specs[0].kind == ComprehensionSpec::FOR",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                  ,0x1b4,
                  "AST *jsonnet::internal::Desugarer::makeArrayComprehension(ArrayComprehension *)")
    ;
  }
  uVar15 = (uint)local_4f8;
  uVar18 = uVar15 - 1;
  lVar21 = (long)(int)uVar18 * 8 + 8;
  pCVar7 = pCVar7 + (int)uVar18;
  do {
    lVar21 = lVar21 + -8;
    pKVar5 = &pCVar7->kind;
    pCVar7 = pCVar7 + -1;
  } while (*pKVar5 != FOR);
  pAVar4 = local_4d8->body;
  ss.buf._M_dataplus._M_p =
       *(pointer *)
        ((long)_aux.
               super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar21);
  local_440._0_8_ =
       Allocator::
       make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                 (local_4f0->alloc,(LocationRange *)E,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,(Identifier **)&ss);
  local_e0.idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        ((long)_i.
               super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar21);
  local_478._0_8_ =
       Allocator::
       make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                 (pDVar17->alloc,(LocationRange *)E,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,(Identifier **)&local_e0);
  local_3e0.
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 3;
  pBVar8 = Allocator::
           make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                     (pDVar17->alloc,(LocationRange *)E,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(Var **)local_478,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(BinaryOp *)&local_3e0,&one);
  ArgParam::ArgParam((ArgParam *)&ss,&pBVar8->super_AST,(Fodder *)EF);
  pDVar17 = local_4f0;
  local_e0.idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4d0;
  local_410.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)Allocator::
                make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                          (local_4f0->alloc,(LocationRange *)E,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(Identifier **)&local_e0);
  local_3f8.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 3;
  local_e0.idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)singleton(pDVar17,local_4d8->body);
  pBVar8 = Allocator::
           make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Array*>
                     (local_4f0->alloc,(LocationRange *)E,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(Var **)&local_410,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(BinaryOp *)&local_3f8,(Array **)&local_e0);
  ArgParam::ArgParam(&local_370,&pBVar8->super_AST,(Fodder *)EF);
  __l._M_len = 2;
  __l._M_array = (iterator)&ss;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             local_1a8,__l,(allocator_type *)&local_f8);
  local_268.
  super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_268.
                        super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  out = (AST *)CONCAT71(out._1_7_,1);
  pAVar9 = Allocator::
           make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     (local_4f0->alloc,&pAVar4->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(Var **)local_440,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                             *)local_1a8,(bool *)&local_268,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,(bool *)&out);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             local_1a8);
  lVar21 = -0xb0;
  pFVar14 = &local_370.commaFodder;
  do {
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(pFVar14);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)((long)(pFVar14 + -2) + 0x10));
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)((long)(pFVar14 + -3) + 8));
    pFVar14 = (Fodder *)((long)(pFVar14 + -4) + 8);
    lVar21 = lVar21 + 0x58;
  } while (lVar21 != 0);
  in = &pAVar9->super_AST;
  if (0 < (int)uVar15) {
    local_4b0 = &local_370;
    local_4e8 = &(local_4d8->super_AST).location;
    local_420 = &local_88;
    uVar23 = (ulong)uVar18;
    lVar21 = (ulong)(uVar15 & 0x7fffffff) * 8;
    lVar13 = (ulong)(uVar15 & 0x7fffffff) * 0x60 + -0xc0;
    local_230 = &local_370.commaFodder;
    local_248 = &local_88.commaFodder;
    local_240 = &local_150.commaFodder;
    pDVar17 = local_4f0;
    do {
      lVar21 = lVar21 + -8;
      pCVar7 = (local_4d8->specs).
               super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_4f8 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)CONCAT71(local_4f8._1_7_,uVar23 == 0);
      local_500 = uVar23;
      local_220 = lVar13;
      if (uVar23 == 0) {
        ss.buf._M_dataplus._M_p = (pointer)local_4d0;
        out = &Allocator::
               make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                         (pDVar17->alloc,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(Identifier **)&ss)->super_AST;
        uVar23 = uVar23 - 1;
      }
      else {
        piVar10 = (int *)((long)&pCVar7->kind + lVar13);
        lVar13 = lVar21;
        do {
          lVar13 = lVar13 + -8;
          iVar2 = *piVar10;
          piVar10 = piVar10 + -0x18;
        } while (iVar2 != 0);
        ss.buf._M_dataplus._M_p =
             *(pointer *)
              ((long)_aux.
                     super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar13);
        local_4a8 = lVar21;
        local_4a0 = uVar23 - 1;
        local_440._0_8_ =
             Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                       (pDVar17->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(Identifier **)&ss);
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)_i.
                     super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar13);
        local_478._0_8_ =
             Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                       (pDVar17->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(Identifier **)&local_e0);
        local_410.
        super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_410.
                               super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
        pBVar8 = Allocator::
                 make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                           (pDVar17->alloc,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,(Var **)local_478,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,(BinaryOp *)&local_410,&one);
        ArgParam::ArgParam((ArgParam *)&ss,&pBVar8->super_AST,(Fodder *)EF);
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4d0;
        pVVar11 = Allocator::
                  make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                            (pDVar17->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(Identifier **)&local_e0);
        ArgParam::ArgParam(&local_370,&pVVar11->super_AST,(Fodder *)EF);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&ss;
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               local_1a8,__l_00,(allocator_type *)&local_e0);
        local_3e0.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ =
             (uint)local_3e0.
                   super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0xffffff00;
        local_3f8.
        super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ =
             CONCAT31(local_3f8.
                      super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_3_,1);
        out = &Allocator::
               make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                         (pDVar17->alloc,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(Var **)local_440,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                 *)local_1a8,(bool *)&local_3e0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,(bool *)&local_3f8)->super_AST;
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )local_1a8);
        lVar13 = -0xb0;
        pFVar14 = local_230;
        do {
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(pFVar14);
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)(pFVar14 + -2) + 0x10));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)(pFVar14 + -3) + 8));
          pFVar14 = (Fodder *)((long)(pFVar14 + -4) + 8);
          lVar13 = lVar13 + 0x58;
          uVar23 = local_4a0;
          lVar21 = local_4a8;
        } while (lVar13 != 0);
      }
      pCVar7 = pCVar7 + local_500;
      if (pCVar7->kind == FOR) {
        local_4a8 = lVar21;
        local_4a0 = uVar23;
        bind((Desugarer *)&ss,(int)pDVar17,(sockaddr *)local_4c0,(socklen_t)pCVar7->expr);
        local_228 = (sockaddr *)
                    _aux.
                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_500];
        ArgParam::ArgParam((ArgParam *)local_1a8,(Fodder *)EF,
                           _i.
                           super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_500],(Fodder *)EF);
        ArgParam::ArgParam(&local_150,(Fodder *)EF,(Identifier *)local_4d0,(Fodder *)EF);
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)local_1a8;
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        vector(&local_3e0,__l_01,&local_4d9);
        local_501 = false;
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)_i.
                      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_500];
        local_1c0 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (pDVar17->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)&local_e0);
        local_494 = BOP_GREATER_EQ;
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = local_4c0;
        pVVar11 = Allocator::
                  make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                            (pDVar17->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(Identifier **)&local_e0);
        local_1c8 = length(pDVar17,&pVVar11->super_AST);
        local_1b8 = Allocator::
                    make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Apply*>
                              (pDVar17->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_1c0,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_494,&local_1c8);
        pIVar6 = pCVar7->var;
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = local_4c0;
        local_1d8 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (pDVar17->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)&local_e0);
        local_502 = false;
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)_i.
                      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_500];
        local_1e0 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (pDVar17->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)&local_e0);
        local_1e8 = (void *)0x0;
        local_1f0 = (void *)0x0;
        body = Allocator::
               make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         (pDVar17->alloc,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_1d8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_502,&local_1e0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_1e8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_1f0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF);
        singleBind(&local_3f8,pDVar17,pIVar6,&body->super_AST);
        local_1d0 = Allocator::
                    make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                              (pDVar17->alloc,local_4e8,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_3f8,&in);
        local_1b0 = Allocator::
                    make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Binary*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Local*>
                              (pDVar17->alloc,local_4e8,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_1b8,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&out,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_1d0);
        pFVar12 = Allocator::
                  make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Conditional*>
                            (pDVar17->alloc,local_4e8,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_3e0,&local_501,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_1b0);
        bind(local_318,(int)pDVar17,local_228,(socklen_t)pFVar12);
        __l_02._M_len = 2;
        __l_02._M_array = (iterator)&ss;
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        vector(&local_410,__l_02,&local_4da);
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = local_4c0;
        pVVar11 = Allocator::
                  make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                            (pDVar17->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(Identifier **)&local_e0);
        pAVar9 = type(pDVar17,&pVVar11->super_AST);
        local_440._0_8_ = local_440 + 0x10;
        ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                  ((u32string *)local_440,L"array",L"");
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_e0.idFodder.
                               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
        b = Allocator::
            make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                      (pDVar17->alloc,(LocationRange *)E,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                              *)local_440,(TokenKind *)&local_e0,(char (*) [1])0x213563,
                       (char (*) [1])0x213563);
        local_200 = equals(pDVar17,local_4e8,&pAVar9->super_AST,&b->super_AST);
        local_e0.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)_aux.
                      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_500];
        local_210 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (pDVar17->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)&local_e0);
        ArgParam::ArgParam(&local_e0,&local_238->super_AST,(Fodder *)EF);
        if (local_500 == 0) {
          local_268.
          super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_268.
          super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_268.
          super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_503 = false;
          expr = Allocator::
                 make<jsonnet::internal::Array,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                           (pDVar17->alloc,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_268,&local_503,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF);
        }
        else {
          local_478._0_8_ = local_4d0;
          expr = (Array *)Allocator::
                          make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                                    (pDVar17->alloc,(LocationRange *)E,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,(Identifier **)local_478);
        }
        ArgParam::ArgParam(&local_88,&expr->super_AST,(Fodder *)EF);
        __l_03._M_len = 2;
        __l_03._M_array = &local_e0;
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        vector(&local_f8,__l_03,&local_4db);
        local_504 = false;
        local_505 = true;
        local_208 = Allocator::
                    make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                              (pDVar17->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_210,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_f8,&local_504,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,&local_505);
        local_478._0_8_ = local_478 + 0x10;
        ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                  ((u32string *)local_478,L"In comprehension, can only iterate over array.",L"");
        args = local_4e8;
        local_218 = error(pDVar17,local_4e8,(UString *)local_478);
        local_1f8 = Allocator::
                    make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Error*>
                              (pDVar17->alloc,args,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_200,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_208,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_218);
        in = &Allocator::
              make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::Conditional*>
                        (pDVar17->alloc,args,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_410,&local_1f8)->super_AST;
        if ((Array *)local_478._0_8_ != (Array *)(local_478 + 0x10)) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ * 4 + 4);
        }
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_f8);
        lVar21 = -0xb0;
        pFVar14 = local_248;
        do {
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(pFVar14);
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)(pFVar14 + -2) + 0x10));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&pFVar14[-3].
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
          pFVar14 = (Fodder *)
                    &pFVar14[-4].
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          lVar21 = lVar21 + 0x58;
        } while (lVar21 != 0);
        if (local_500 == 0) {
          ::std::
          vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ::~vector(&local_268);
        }
        if ((Var *)local_440._0_8_ != (Var *)(local_440 + 0x10)) {
          operator_delete((void *)local_440._0_8_,local_440._16_8_ * 4 + 4);
        }
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        ~vector(&local_410);
        lVar22 = 0xd0;
        lVar20 = 0xf8;
        lVar16 = 0x110;
        lVar13 = 0x130;
        lVar24 = 0x148;
        lVar21 = 0xb0;
        do {
          local_4f8 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)((long)&ss.buf._M_dataplus._M_p + lVar21);
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)&ss.buf._M_dataplus._M_p + lVar24));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)&ss.buf._M_dataplus._M_p + lVar13));
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)((long)&ss.buf._M_dataplus._M_p + lVar16));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)&ss.buf._M_dataplus._M_p + lVar20));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)&ss.buf._M_dataplus._M_p + lVar22));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(local_4f8);
          lVar22 = lVar22 + -0xb0;
          lVar20 = lVar20 + -0xb0;
          lVar16 = lVar16 + -0xb0;
          lVar13 = lVar13 + -0xb0;
          lVar24 = lVar24 + -0xb0;
          lVar21 = lVar21 + -0xb0;
        } while (lVar21 != -0xb0);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        ~vector(&local_3f8);
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_3e0);
        lVar13 = -0xb0;
        pFVar14 = local_240;
        do {
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(pFVar14);
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)(pFVar14 + -2) + 0x10));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&pFVar14[-3].
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
          pFVar14 = (Fodder *)
                    &pFVar14[-4].
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          lVar13 = lVar13 + 0x58;
          uVar23 = local_4a0;
          pDVar17 = local_4f0;
          lVar21 = local_4a8;
        } while (lVar13 != 0);
      }
      else if (pCVar7->kind == IF) {
        in = &Allocator::
              make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                        (pDVar17->alloc,local_4e8,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&pCVar7->expr,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&in,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&out)->super_AST;
      }
      lVar13 = local_220 + -0x60;
    } while (0 < (long)local_500);
  }
  pAVar4 = in;
  if (_aux.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(_aux.
                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)_aux.
                          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)_aux.
                          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (_i.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(_i.
                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)_i.
                          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)_i.
                          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pAVar4;
}

Assistant:

AST* makeArrayComprehension(ArrayComprehension *ast) {
        int n = ast->specs.size();
        AST *zero = make<LiteralNumber>(E, EF, "0.0");
        AST *one = make<LiteralNumber>(E, EF, "1.0");
        auto *_r = id(U"$r");
        auto *_l = id(U"$l");
        std::vector<const Identifier *> _i(n);
        for (int i = 0; i < n; ++i) {
            UStringStream ss;
            ss << U"$i_" << i;
            _i[i] = id(ss.str());
        }
        std::vector<const Identifier *> _aux(n);
        for (int i = 0; i < n; ++i) {
            UStringStream ss;
            ss << U"$aux_" << i;
            _aux[i] = id(ss.str());
        }

        // Build it from the inside out.  We keep wrapping 'in' with more ASTs.
        assert(ast->specs[0].kind == ComprehensionSpec::FOR);

        int last_for = n - 1;
        while (ast->specs[last_for].kind != ComprehensionSpec::FOR)
            last_for--;
        // $aux_{last_for}($i_{last_for} + 1, $r + [body])
        AST *in = make<Apply>(
            ast->body->location,
            EF,
            var(_aux[last_for]),
            EF,
            ArgParams{{make<Binary>(E, EF, var(_i[last_for]), EF, BOP_PLUS, one), EF},
                {make<Binary>(E, EF, var(_r), EF, BOP_PLUS, singleton(ast->body)), EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
        for (int i = n - 1; i >= 0; --i) {
            const ComprehensionSpec &spec = ast->specs[i];
            AST *out;
            if (i > 0) {
                int prev_for = i - 1;
                while (ast->specs[prev_for].kind != ComprehensionSpec::FOR)
                    prev_for--;

                // aux_{prev_for}($i_{prev_for} + 1, $r)
                out = make<Apply>(  // False branch.
                    E,
                    EF,
                    var(_aux[prev_for]),
                    EF,
                    ArgParams{{
                        make<Binary>(E, EF, var(_i[prev_for]), EF, BOP_PLUS, one),
                            EF,
                            },
                      {
                        var(_r),
                            EF,
                            }},
                    false,  // trailingComma
                    EF,
                    EF,
                    true  // tailstrict
                );
            } else {
                out = var(_r);
            }
            switch (spec.kind) {
                case ComprehensionSpec::IF: {
                  /*
                    if [[[...cond...]]] then
                    [[[...in...]]]
                    else
                    [[[...out...]]]
                  */
                    in = make<Conditional>(ast->location,
                                           EF,
                                           spec.expr,
                                           EF,
                                           in,  // True branch.
                                           EF,
                                           out);  // False branch.
                } break;
                case ComprehensionSpec::FOR: {
                    /*
                      local $l = [[[...array...]]]
                      aux_{i}(i_{i}, r) =
                      if i_{i} >= std.length($l) then
                      [[[...out...]]]
                      else
                      local [[[...var...]]] = $l[i_{i}];
                      [[[...in...]]];
                      if std.type($l) == "array" then
                      aux_{i}(0, $r) tailstrict
                      else
                      error "In comprehension, can only iterate over array..";
                    */
                    in = make<Local>(
                        ast->location,
                        EF,
                        Local::Binds{
                          bind(_l, spec.expr),  // Need to check expr is an array
                              bind(_aux[i],
                                   make<Function>(
                                       ast->location,
                                       EF,
                                       EF,
                                       ArgParams{{EF, _i[i], EF}, {EF, _r, EF}},
                                       false,  // trailingComma
                                       EF,
                                       make<Conditional>(ast->location,
                                                         EF,
                                                         make<Binary>(E,
                                                                      EF,
                                                                      var(_i[i]),
                                                                      EF,
                                                                      BOP_GREATER_EQ,
                                                                      length(var(_l))),
                                                         EF,
                                                         out,
                                                         EF,
                                                         make<Local>(
                                                             ast->location,
                                                             EF,
                                                             singleBind(spec.var,
                                                                        make<Index>(E,
                                                                                    EF,
                                                                                    var(_l),
                                                                                    EF,
                                                                                    false,
                                                                                    var(_i[i]),
                                                                                    EF,
                                                                                    nullptr,
                                                                                    EF,
                                                                                    nullptr,
                                                                                    EF)),
                                                             in))))},
                        make<Conditional>(
                            ast->location,
                            EF,
                            equals(ast->location, type(var(_l)), str(U"array")),
                            EF,
                            make<Apply>(
                                E,
                                EF,
                                var(_aux[i]),
                                EF,
                                ArgParams{{zero, EF},
                                  {
                                    i == 0 ? make<Array>(
                                        E, EF, Array::Elements{}, false, EF)
                                        : static_cast<AST *>(var(_r)),
                                        EF,
                                        }},
                                false,  // trailingComma
                                EF,
                                EF,
                                true),  // tailstrict
                            EF,
                            error(ast->location,
                                  U"In comprehension, can only iterate over array.")));
                } break;
            }
        }

        return in;
    }